

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bake.c
# Opt level: O0

err_t bakeBMQVRunB(octet *key,bign_params *params,bake_settings *settings,octet *privkeyb,
                  bake_cert *certb,bake_cert *certa,read_i read,write_i write,void *file)

{
  bool_t bVar1;
  octet *state_00;
  blob_t pvVar2;
  long lVar3;
  octet *key_00;
  uint uVar4;
  void *in_RCX;
  int *in_RDX;
  bake_cert *in_RSI;
  octet *in_RDI;
  bign_params *in_R8;
  bake_settings *in_R9;
  code *in_stack_00000008;
  void *state;
  octet *out;
  octet *in;
  blob_t blob;
  size_t len;
  err_t code;
  size_t in_stack_ffffffffffffff88;
  blob_t state_01;
  bake_cert *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar5;
  
  bVar1 = memIsValid(in_RDI,0x20);
  if (bVar1 == 0) {
    eVar5 = 0x6d;
  }
  else if (((in_RSI->data == (octet *)0x80) || (in_RSI->data == (octet *)0xc0)) ||
          (in_RSI->data == (octet *)0x100)) {
    state_00 = in_RSI->data + 8;
    bakeBMQV_keep((size_t)state_00);
    pvVar2 = blobCreate(in_stack_ffffffffffffff88);
    if (pvVar2 == (blob_t)0x0) {
      eVar5 = 0x6e;
    }
    else {
      lVar3 = (long)pvVar2 + ((ulong)in_RSI->data >> 1) + 8;
      key_00 = (octet *)(lVar3 + ((ulong)in_RSI->data >> 1));
      state_01 = pvVar2;
      eVar5 = bakeBMQVStart(in_RCX,in_R8,in_R9,
                            (octet *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffb8);
      if (eVar5 == 0) {
        eVar5 = bakeBMQVStep2((octet *)in_stack_ffffffffffffffb8,state_01);
        if (eVar5 == 0) {
          eVar5 = (*(code *)state)(&stack0xffffffffffffffb8,lVar3,(ulong)in_RSI->data >> 1,out);
          if (eVar5 == 0) {
            uVar4 = 0;
            if (*in_RDX != 0) {
              uVar4 = 8;
            }
            eVar5 = (*in_stack_00000008)
                              (&stack0xffffffffffffffb8,pvVar2,
                               ((ulong)in_RSI->data >> 1) + (ulong)uVar4,out);
            if (eVar5 == 0) {
              eVar5 = bakeBMQVStep4((octet *)CONCAT44(in_stack_fffffffffffffffc,
                                                      in_stack_fffffffffffffff8),in_RDI,in_RSI,
                                    in_RDX);
              if (eVar5 == 0) {
                if ((in_RDX[1] == 0) ||
                   (eVar5 = (*(code *)state)(&stack0xffffffffffffffb8,lVar3,8,out), eVar5 == 0)) {
                  eVar5 = bakeBMQVStepG(key_00,state_00);
                  blobClose((blob_t)0x11d485);
                }
                else {
                  blobClose((blob_t)0x11d45c);
                }
              }
              else {
                blobClose((blob_t)0x11d411);
              }
            }
            else {
              blobClose((blob_t)0x11d3d6);
            }
          }
          else {
            blobClose((blob_t)0x11d372);
          }
        }
        else {
          blobClose((blob_t)0x11d329);
        }
      }
      else {
        blobClose((blob_t)0x11d2f8);
      }
    }
  }
  else {
    eVar5 = 0x1f6;
  }
  return eVar5;
}

Assistant:

err_t bakeBMQVRunB(octet key[32], const bign_params* params,
	const bake_settings* settings, const octet privkeyb[],
	const bake_cert* certb, const bake_cert* certa,
	read_i read, write_i write, void* file)
{
	err_t code;
	size_t len;
	// блоб
	blob_t blob;
	octet* in;			/* [l / 2 + 8] */
	octet* out;			/* [l / 2] */
	void* state;		/* [bakeBMQV_keep()] */
	// проверить key
	if (!memIsValid(key, 32))
		return ERR_BAD_INPUT;
	// создать блоб
	if (params->l != 128 && params->l != 192 && params->l != 256)
		return ERR_BAD_PARAMS;
	blob = blobCreate(params->l + 8 + bakeBMQV_keep(params->l));
	if (blob == 0)
		return ERR_OUTOFMEMORY;
	// раскладка блоба
	in = (octet*)blob;
	out = in + params->l / 2 + 8;
	state = out + params->l / 2;
	// старт
	code = bakeBMQVStart(state, params, settings, privkeyb, certb);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 2
	code = bakeBMQVStep2(out, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = write(&len, out, params->l / 2, file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	// шаг 4
	code = read(&len, in, params->l / 2 + (settings->kca ? 8u : 0), file);
	ERR_CALL_HANDLE(code, blobClose(blob));
	code = bakeBMQVStep4(out, in, certa, state);
	ERR_CALL_HANDLE(code, blobClose(blob));
	if (settings->kcb)
	{
		code = write(&len, out, 8, file);
		ERR_CALL_HANDLE(code, blobClose(blob));
	}
	// завершение
	code = bakeBMQVStepG(key, state);
	blobClose(blob);
	return code;
}